

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::Config::getTestListFile_abi_cxx11_(string *__return_storage_ptr__,Config *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->m_data).testListFile._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (this->m_data).testListFile._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string Config::getTestListFile() const { return m_data.testListFile; }